

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int detect_flash(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,int offset)

{
  FIRSTPASS_STATS *pFVar1;
  int in_EDX;
  TWO_PASS_FRAME *in_RSI;
  TWO_PASS *in_RDI;
  FIRSTPASS_STATS *next_frame;
  bool local_21;
  
  pFVar1 = read_frame_stats(in_RDI,in_RSI,in_EDX);
  local_21 = false;
  if ((pFVar1 != (FIRSTPASS_STATS *)0x0) &&
     (local_21 = false,
     pFVar1->pcnt_inter <= pFVar1->pcnt_second_ref && pFVar1->pcnt_second_ref != pFVar1->pcnt_inter)
     ) {
    local_21 = 0.5 <= pFVar1->pcnt_second_ref;
  }
  return (int)local_21;
}

Assistant:

static int detect_flash(const TWO_PASS *twopass,
                        const TWO_PASS_FRAME *twopass_frame, const int offset) {
  const FIRSTPASS_STATS *const next_frame =
      read_frame_stats(twopass, twopass_frame, offset);

  // What we are looking for here is a situation where there is a
  // brief break in prediction (such as a flash) but subsequent frames
  // are reasonably well predicted by an earlier (pre flash) frame.
  // The recovery after a flash is indicated by a high pcnt_second_ref
  // compared to pcnt_inter.
  return next_frame != NULL &&
         next_frame->pcnt_second_ref > next_frame->pcnt_inter &&
         next_frame->pcnt_second_ref >= 0.5;
}